

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena-test.c++
# Opt level: O1

void __thiscall kj::anon_unknown_0::TestCase133::run(TestCase133 *this)

{
  TestObject *pTVar1;
  size_t sVar2;
  TestObject *pTVar3;
  size_t sVar4;
  char *in_R8;
  DebugComparison<kj::(anonymous_namespace)::TestObject_*,_kj::(anonymous_namespace)::TestObject_*>
  *in_R9;
  TestObject *ptrCopy_1;
  TestObject *ptrCopy;
  TestObject **in_stack_ffffffffffffff38;
  DebugComparison<unsigned_int,_unsigned_long> _kjCondition;
  TestObject *local_98;
  TestObject *local_90;
  Array<kj::(anonymous_namespace)::TestObject> arr1;
  Array<kj::(anonymous_namespace)::TestObject> arr2;
  Arena arena;
  
  (anonymous_namespace)::TestObject::count = 0;
  (anonymous_namespace)::TestObject::throwAt = 0xffffffff;
  Arena::Arena(&arena,0x400);
  Arena::allocateOwnArray<kj::(anonymous_namespace)::TestObject>(&arr1,&arena,4);
  Arena::allocateOwnArray<kj::(anonymous_namespace)::TestObject>(&arr2,&arena,2);
  sVar2 = arr1.size_;
  _kjCondition.left = 4;
  _kjCondition.right = arr1.size_;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = arr1.size_ == 4;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    local_90 = (TestObject *)CONCAT44(local_90._4_4_,4);
    local_98 = (TestObject *)arr1.size_;
    in_R8 = "failed: expected (4u) == (arr1.size())";
    in_R9 = (DebugComparison<kj::(anonymous_namespace)::TestObject_*,_kj::(anonymous_namespace)::TestObject_*>
             *)&_kjCondition;
    kj::_::Debug::
    log<char_const(&)[39],kj::_::DebugComparison<unsigned_int,unsigned_long>&,unsigned_int,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/arena-test.c++"
               ,0x8e,ERROR,
               "\"failed: expected \" \"(4u) == (arr1.size())\", _kjCondition, 4u, arr1.size()",
               (char (*) [39])"failed: expected (4u) == (arr1.size())",
               (DebugComparison<unsigned_int,_unsigned_long> *)in_R9,(uint *)&local_90,
               (unsigned_long *)&local_98);
  }
  sVar4 = arr2.size_;
  _kjCondition.left = 2;
  _kjCondition.right = arr2.size_;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = arr2.size_ == 2;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    local_90 = (TestObject *)CONCAT44(local_90._4_4_,2);
    local_98 = (TestObject *)arr2.size_;
    in_R8 = "failed: expected (2u) == (arr2.size())";
    in_R9 = (DebugComparison<kj::(anonymous_namespace)::TestObject_*,_kj::(anonymous_namespace)::TestObject_*>
             *)&_kjCondition;
    kj::_::Debug::
    log<char_const(&)[39],kj::_::DebugComparison<unsigned_int,unsigned_long>&,unsigned_int,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/arena-test.c++"
               ,0x8f,ERROR,
               "\"failed: expected \" \"(2u) == (arr2.size())\", _kjCondition, 2u, arr2.size()",
               (char (*) [39])"failed: expected (2u) == (arr2.size())",
               (DebugComparison<unsigned_int,_unsigned_long> *)in_R9,(uint *)&local_90,
               (unsigned_long *)&local_98);
  }
  pTVar3 = arr2.ptr;
  pTVar1 = arr1.ptr;
  _kjCondition._0_8_ = arr1.ptr + sVar2;
  _kjCondition.right = (unsigned_long)arr2.ptr;
  _kjCondition.op.content.ptr = " <= ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = (ulong)_kjCondition._0_8_ <= arr2.ptr;
  if ((arr2.ptr < (ulong)_kjCondition._0_8_) && (kj::_::Debug::minSeverity < 3)) {
    local_90 = arr2.ptr;
    local_98 = (TestObject *)_kjCondition._0_8_;
    kj::_::Debug::
    log<char_const(&)[48],kj::_::DebugComparison<kj::(anonymous_namespace)::TestObject*,kj::(anonymous_namespace)::TestObject*>&,kj::(anonymous_namespace)::TestObject*,kj::(anonymous_namespace)::TestObject*>
              ((char *)0x90,(int)&_kjCondition,(LogSeverity)&local_98,(char *)&local_90,
               (char (*) [48])in_R8,in_R9,in_stack_ffffffffffffff38,
               (TestObject **)_kjCondition._0_8_);
  }
  _kjCondition.result = (anonymous_namespace)::TestObject::count == 6;
  _kjCondition.left = 6;
  _kjCondition.right = (unsigned_long)&(anonymous_namespace)::TestObject::count;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    local_98 = (TestObject *)CONCAT44(local_98._4_4_,6);
    kj::_::Debug::log<char_const(&)[44],kj::_::DebugComparison<int,int&>&,int,int&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/arena-test.c++"
               ,0x91,ERROR,
               "\"failed: expected \" \"(6) == (TestObject::count)\", _kjCondition, 6, TestObject::count"
               ,(char (*) [44])"failed: expected (6) == (TestObject::count)",
               (DebugComparison<int,_int_&> *)&_kjCondition,(int *)&local_98,
               &(anonymous_namespace)::TestObject::count);
  }
  if (pTVar3 != (TestObject *)0x0) {
    arr2.ptr = (TestObject *)0x0;
    arr2.size_ = 0;
    (**(arr2.disposer)->_vptr_ArrayDisposer)
              (arr2.disposer,pTVar3,4,sVar4,sVar4,
               ArrayDisposer::Dispose_<kj::(anonymous_namespace)::TestObject>::destruct);
  }
  if (pTVar1 != (TestObject *)0x0) {
    arr1.ptr = (TestObject *)0x0;
    arr1.size_ = 0;
    (**(arr1.disposer)->_vptr_ArrayDisposer)
              (arr1.disposer,pTVar1,4,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::(anonymous_namespace)::TestObject>::destruct);
  }
  _kjCondition.result = (anonymous_namespace)::TestObject::count == 0;
  _kjCondition._0_8_ = _kjCondition._0_8_ & 0xffffffff00000000;
  _kjCondition.right = (unsigned_long)&(anonymous_namespace)::TestObject::count;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    arr1.ptr = (TestObject *)((ulong)arr1.ptr & 0xffffffff00000000);
    kj::_::Debug::log<char_const(&)[44],kj::_::DebugComparison<int,int&>&,int,int&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/arena-test.c++"
               ,0x94,ERROR,
               "\"failed: expected \" \"(0) == (TestObject::count)\", _kjCondition, 0, TestObject::count"
               ,(char (*) [44])"failed: expected (0) == (TestObject::count)",
               (DebugComparison<int,_int_&> *)&_kjCondition,(int *)&arr1,
               &(anonymous_namespace)::TestObject::count);
  }
  Arena::~Arena(&arena);
  return;
}

Assistant:

TEST(Arena, OwnArray) {
  TestObject::count = 0;
  TestObject::throwAt = -1;

  Arena arena;

  {
    Array<TestObject> arr1 = arena.allocateOwnArray<TestObject>(4);
    Array<TestObject> arr2 = arena.allocateOwnArray<TestObject>(2);
    EXPECT_EQ(4u, arr1.size());
    EXPECT_EQ(2u, arr2.size());
    EXPECT_LE(arr1.end(), arr2.begin());
    EXPECT_EQ(6, TestObject::count);
  }

  EXPECT_EQ(0, TestObject::count);
}